

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_recv_atleast(Curl_easy *data,size_t nbytes)

{
  CURLcode CVar1;
  ulong uVar2;
  dynbuf *s;
  ssize_t nread;
  uchar readbuf [1024];
  size_t local_420;
  char local_418 [1024];
  
  s = &((data->req).p.mqtt)->recvbuf;
  uVar2 = Curl_dyn_len(s);
  if (uVar2 <= nbytes && nbytes - uVar2 != 0) {
    CVar1 = Curl_xfer_recv(data,local_418,nbytes - uVar2,(ssize_t *)&local_420);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    CVar1 = Curl_dyn_addn(s,local_418,local_420);
    if (CVar1 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
    uVar2 = Curl_dyn_len(s);
  }
  CVar1 = CURLE_AGAIN;
  if (nbytes <= uVar2) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode mqtt_recv_atleast(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = data->req.p.mqtt;
  size_t rlen = Curl_dyn_len(&mq->recvbuf);
  CURLcode result;

  if(rlen < nbytes) {
    unsigned char readbuf[1024];
    ssize_t nread;

    DEBUGASSERT(nbytes - rlen < sizeof(readbuf));
    result = Curl_xfer_recv(data, (char *)readbuf, nbytes - rlen, &nread);
    if(result)
      return result;
    DEBUGASSERT(nread >= 0);
    if(Curl_dyn_addn(&mq->recvbuf, readbuf, (size_t)nread))
      return CURLE_OUT_OF_MEMORY;
    rlen = Curl_dyn_len(&mq->recvbuf);
  }
  return (rlen >= nbytes) ? CURLE_OK : CURLE_AGAIN;
}